

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

NameSet * wasm::BranchUtils::getUniqueTargets(NameSet *__return_storage_ptr__,Expression *expr)

{
  Expression *expr_local;
  NameSet *ret;
  
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            (__return_storage_ptr__);
  operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
            (expr,(anon_class_8_1_ba1d7401)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline NameSet getUniqueTargets(Expression* expr) {
  NameSet ret;
  operateOnScopeNameUses(expr, [&](Name& name) { ret.insert(name); });
  return ret;
}